

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O1

unsigned_long __thiscall OpenTypeFileInput::GetTag(OpenTypeFileInput *this,char *inTagName)

{
  size_t sVar1;
  ulong uVar2;
  Byte buffer [4];
  uint local_c;
  
  sVar1 = strlen(inTagName);
  uVar2 = 0;
  if (sVar1 != 0) {
    do {
      *(char *)((long)&local_c + uVar2) = inTagName[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffff) < sVar1);
  }
  if ((ushort)uVar2 < 4) {
    memset((void *)((long)&local_c + (uVar2 & 0xffff)),0x20,(ulong)(4U - (int)uVar2 & 0xffff));
  }
  return (ulong)(local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 |
                local_c << 0x18);
}

Assistant:

unsigned long OpenTypeFileInput::GetTag(const char* inTagName)

{
	Byte buffer[4];
	unsigned short i=0;

	for(; i<strlen(inTagName);++i)
		buffer[i] = (Byte)inTagName[i];
	for(;i<4;++i)
		buffer[i] = 0x20;

	return	((unsigned long)buffer[0]<<24) + ((unsigned long)buffer[1]<<16) + 
			((unsigned long)buffer[2]<<8) + buffer[3];
}